

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-math.h
# Opt level: O0

unsigned_long wabt::interp::IntTruncSat<unsigned_long,double>(double val)

{
  bool bVar1;
  uint uVar2;
  double dVar3;
  double val_local;
  
  uVar2 = std::isnan(val);
  if ((uVar2 & 1) == 0) {
    bVar1 = CanConvert<unsigned_long,double>((f64)val);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      val_local = (double)((long)val | (long)(val - 9.223372036854776e+18) & (long)val >> 0x3f);
    }
    else {
      bVar1 = std::signbit(val);
      dVar3 = (double)std::numeric_limits<unsigned_long>::min();
      val_local = (double)std::numeric_limits<unsigned_long>::max();
      if (bVar1) {
        val_local = dVar3;
      }
    }
  }
  else {
    val_local = 0.0;
  }
  return (unsigned_long)val_local;
}

Assistant:

R WABT_VECTORCALL IntTruncSat(T val) {
  if (WABT_UNLIKELY(std::isnan(val))) {
    return 0;
  } else if (WABT_UNLIKELY(!CanConvert<R>(val))) {
    return std::signbit(val) ? std::numeric_limits<R>::min()
                             : std::numeric_limits<R>::max();
  } else {
    return static_cast<R>(val);
  }
}